

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontInfo.cpp
# Opt level: O1

void __thiscall FontInfo::writeToTextFile(FontInfo *this,string *fileName)

{
  char cVar1;
  char cVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  pointer pbVar6;
  pointer pCVar7;
  pointer pKVar8;
  ostream *poVar9;
  long *plVar10;
  uint8_t charSet;
  ulong uVar11;
  pointer pCVar12;
  long lVar13;
  pointer pKVar14;
  ofstream f;
  string local_250;
  long local_230;
  filebuf local_228 [8];
  undefined8 uStack_220;
  uint auStack_218 [56];
  ios_base local_138 [264];
  
  std::ofstream::ofstream((ostream *)&local_230,(string *)fileName,_S_out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"info",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," face=\"",7);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_230,(this->info).face._M_dataplus._M_p,
                      (this->info).face._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," size=",6);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(this->info).size);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," bold=",6);
  poVar9 = std::ostream::_M_insert<bool>(SUB81(poVar9,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," italic=",8);
  poVar9 = std::ostream::_M_insert<bool>(SUB81(poVar9,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," charset=\"",10);
  if ((this->info).unicode == true) {
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"");
  }
  else {
    getCharSetName_abi_cxx11_(&local_250,(FontInfo *)(ulong)(this->info).charset,charSet);
  }
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,local_250._M_dataplus._M_p,local_250._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," unicode=",9);
  poVar9 = std::ostream::_M_insert<bool>(SUB81(poVar9,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," stretchH=",10);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," smooth=",8);
  poVar9 = std::ostream::_M_insert<bool>(SUB81(poVar9,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," aa=",4);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(uint)(this->info).aa);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," padding=",9);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(uint)(this->info).padding.up);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,",",1);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(uint)(this->info).padding.right);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,",",1);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(uint)(this->info).padding.down);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,",",1);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(uint)(this->info).padding.left);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," spacing=",9);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(uint)(this->info).spacing.horizontal);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,",",1);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(uint)(this->info).spacing.vertical);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," outline=",9);
  plVar10 = (long *)std::ostream::operator<<(poVar9,(uint)(this->info).outline);
  std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
  std::ostream::put((char)plVar10);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"common",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," lineHeight=",0xc);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," base=",6);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," scaleW=",8);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," scaleH=",8);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," pages=",7);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," packed=",8);
  poVar9 = std::ostream::_M_insert<bool>(SUB81(poVar9,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," alphaChnl=",0xb);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(uint)(this->common).alphaChnl);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," redChnl=",9);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(uint)(this->common).redChnl);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," greenChnl=",0xb);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,(uint)(this->common).greenChnl);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," blueChnl=",10);
  std::ostream::operator<<(poVar9,(uint)(this->common).blueChnl);
  if (this->extraInfo == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," totalHeight=",0xd);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
  }
  std::ios::widen((char)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
  std::ostream::put((char)&local_230);
  std::ostream::flush();
  if ((this->pages).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->pages).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar13 = 8;
    uVar11 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"page id=",8);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," file=\"",7);
      pbVar6 = (this->pages).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,*(char **)((long)pbVar6 + lVar13 + -8),
                          *(long *)((long)&(pbVar6->_M_dataplus)._M_p + lVar13));
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      uVar11 = uVar11 + 1;
      lVar13 = lVar13 + 0x20;
    } while (uVar11 < (ulong)((long)(this->pages).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->pages).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"chars count=",0xc);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) =
       *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) & 0xffffff4f | 0x20;
  pCVar7 = (this->chars).super__Vector_base<FontInfo::Char,_std::allocator<FontInfo::Char>_>._M_impl
           .super__Vector_impl_data._M_finish;
  for (pCVar12 = (this->chars).super__Vector_base<FontInfo::Char,_std::allocator<FontInfo::Char>_>.
                 _M_impl.super__Vector_impl_data._M_start; pCVar12 != pCVar7; pCVar12 = pCVar12 + 1)
  {
    sVar3 = pCVar12->xoffset;
    sVar4 = pCVar12->yoffset;
    sVar5 = pCVar12->xadvance;
    cVar1 = pCVar12->page;
    cVar2 = pCVar12->chnl;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"char",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," id=",4);
    *(undefined8 *)((long)&uStack_220 + *(long *)(local_230 + -0x18)) = 4;
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," x=",3);
    *(undefined8 *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x10) = 5;
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," y=",3);
    *(undefined8 *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x10) = 5;
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," width=",7);
    *(undefined8 *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x10) = 5;
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," height=",8);
    *(undefined8 *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x10) = 5;
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," xoffset=",9);
    *(undefined8 *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x10) = 5;
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,sVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," yoffset=",9);
    *(undefined8 *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x10) = 5;
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,sVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," xadvance=",10);
    *(undefined8 *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x10) = 5;
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,sVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," page=",6);
    *(undefined8 *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x10) = 2;
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,(int)cVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," chnl=",6);
    *(undefined8 *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x10) = 2;
    plVar10 = (long *)std::ostream::operator<<(poVar9,(int)cVar2);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    std::ostream::flush();
  }
  *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) =
       *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) & 0xffffff4f | 0x80;
  if ((this->kernings).super__Vector_base<FontInfo::Kerning,_std::allocator<FontInfo::Kerning>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->kernings).super__Vector_base<FontInfo::Kerning,_std::allocator<FontInfo::Kerning>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"kernings count=",0xf);
    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    pKVar14 = (this->kernings).
              super__Vector_base<FontInfo::Kerning,_std::allocator<FontInfo::Kerning>_>._M_impl.
              super__Vector_impl_data._M_start;
    pKVar8 = (this->kernings).
             super__Vector_base<FontInfo::Kerning,_std::allocator<FontInfo::Kerning>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pKVar14 != pKVar8) {
      do {
        sVar3 = pKVar14->amount;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"kerning ",8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"first=",6);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," second=",8);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9," amount=",8);
        plVar10 = (long *)std::ostream::operator<<(poVar9,sVar3);
        std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
        std::ostream::put((char)plVar10);
        std::ostream::flush();
        pKVar14 = pKVar14 + 1;
      } while (pKVar14 != pKVar8);
    }
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _FT_Get_Char_Index;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void FontInfo::writeToTextFile(const std::string &fileName) const
{
    std::ofstream f(fileName);

    f << "info"
        << " face=\"" << info.face << "\""
        << " size=" << info.size
        << " bold=" << info.bold
        << " italic=" << info.italic
        << " charset=\"" << (info.unicode ? "" : getCharSetName(info.charset)) << "\""
        << " unicode=" << info.unicode
        << " stretchH=" << info.stretchH
        << " smooth=" << info.smooth
        << " aa=" << static_cast<int>(info.aa)
        << " padding="
           << static_cast<int>(info.padding.up)
           << "," << static_cast<int>(info.padding.right)
           << "," << static_cast<int>(info.padding.down)
           << "," << static_cast<int>(info.padding.left)
        << " spacing="
            << static_cast<int>(info.spacing.horizontal)
            << "," << static_cast<int>(info.spacing.vertical)
        << " outline=" << static_cast<int>(info.outline)
        << std::endl;

    f << "common"
        << " lineHeight=" << common.lineHeight
        << " base=" << common.base
        << " scaleW=" << common.scaleW
        << " scaleH=" << common.scaleH
        << " pages=" << pages.size()
        << " packed=" << common.packed
        << " alphaChnl=" << static_cast<int>(common.alphaChnl)
        << " redChnl=" << static_cast<int>(common.redChnl)
        << " greenChnl=" << static_cast<int>(common.greenChnl)
        << " blueChnl=" << static_cast<int>(common.blueChnl);
    if (extraInfo)
        f << " totalHeight=" << common.totalHeight;
    f << std::endl;

    for (size_t i = 0; i < pages.size(); ++i)
        f << "page id=" << i << " file=\"" << pages[i] << "\"" << std::endl;

    f << "chars count=" << chars.size() << std::endl;
    f << std::left;
    for(auto c: chars)
    {
        f << "char"
            << " id=" <<  std::setw(4) << c.id
            << " x=" << std::setw(5) << c.x
            << " y=" << std::setw(5) << c.y
            << " width=" << std::setw(5) << c.width
            << " height=" << std::setw(5) << c.height
            << " xoffset=" << std::setw(5) << c.xoffset
            << " yoffset=" << std::setw(5) << c.yoffset
            << " xadvance=" << std::setw(5) << c.xadvance
            << " page=" << std::setw(2) << static_cast<int>(c.page)
            << " chnl=" << std::setw(2) << static_cast<int>(c.chnl)
            << std::endl;
    }
    f << std::right;
    if (!kernings.empty())
    {
        f << "kernings count=" << kernings.size() << std::endl;
        for(auto k: kernings)
        {
            f << "kerning "
              << "first=" << k.first
              << " second=" << k.second
              << " amount=" << k.amount
              << std::endl;
        }
    }
}